

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# position.cpp
# Opt level: O2

void __thiscall position::undo_move(position *this,Move *m)

{
  byte bVar1;
  Color CVar2;
  U64 UVar3;
  Square *pSVar4;
  long lVar5;
  Piece *pPVar6;
  Color *c;
  info *piVar7;
  info *ifo;
  Square *t;
  byte bVar8;
  Square rt;
  Color us;
  Square to;
  Square from;
  Piece local_40;
  Piece cp;
  Piece p;
  Square rf;
  
  bVar8 = 0;
  from = (Square)m->t;
  to = (Square)m->f;
  bVar1 = m->type;
  p = (this->pcs).piece_on._M_elems[m->t];
  CVar2 = (this->ifo).stm;
  us = CVar2 ^ black;
  ifo = &this->ifo;
  cp = (this->ifo).captured;
  if (bVar1 == 0xc) {
    piece_data::do_quiet(&this->pcs,&us,&p,&from,&to,ifo);
    rt = (this->ifo).stm;
    c = &rt;
    rf = (from + (uint)(us != white) * 0x10) - A2;
    pSVar4 = &rf;
    pPVar6 = &cp;
  }
  else if (bVar1 == 0xb) {
    pSVar4 = &from;
    piece_data::do_quiet(&this->pcs,&us,&p,pSVar4,&to,ifo);
    rt = (this->ifo).stm;
    c = &rt;
    pPVar6 = &cp;
  }
  else {
    if (bVar1 == 10) {
      pPVar6 = &p;
      pSVar4 = &from;
      t = &to;
LAB_0011d5ad:
      piece_data::do_quiet(&this->pcs,&us,pPVar6,pSVar4,t,ifo);
      goto LAB_0011d70e;
    }
    rt = p;
    if (bVar1 < 4) {
      piece_data::remove_piece(&this->pcs,&us,&rt,&from,ifo);
    }
    else {
      if (7 < bVar1) {
        if (bVar1 == 9) {
          rt = D8;
          if (CVar2 == black) {
            rt = D1;
          }
          rf = A8;
          if (CVar2 == black) {
            rf = A1;
          }
          t = &rf;
          local_40 = king;
          piece_data::do_quiet(&this->pcs,&us,&local_40,&from,&to,ifo);
          local_40 = rook;
          pPVar6 = &local_40;
          pSVar4 = &rt;
        }
        else {
          if (bVar1 != 8) goto LAB_0011d70e;
          rt = H8;
          if (CVar2 == black) {
            rt = H1;
          }
          rf = F8;
          if (CVar2 == black) {
            rf = F1;
          }
          pSVar4 = &rf;
          local_40 = king;
          piece_data::do_quiet(&this->pcs,&us,&local_40,&from,&to,ifo);
          local_40 = rook;
          pPVar6 = &local_40;
          t = &rt;
        }
        goto LAB_0011d5ad;
      }
      piece_data::remove_piece(&this->pcs,&us,&rt,&from,ifo);
      rt = (this->ifo).stm;
      piece_data::add_piece(&this->pcs,&rt,&cp,&from,ifo);
    }
    c = &us;
    rt = A1;
    pPVar6 = &rt;
    pSVar4 = &to;
  }
  piece_data::add_piece(&this->pcs,c,pPVar6,pSVar4,ifo);
LAB_0011d70e:
  UVar3 = this->hidx;
  this->hidx = UVar3 - 1;
  piVar7 = this->history + (UVar3 - 1);
  for (lVar5 = 0xc; lVar5 != 0; lVar5 = lVar5 + -1) {
    ifo->checkers = piVar7->checkers;
    piVar7 = (info *)((long)piVar7 + ((ulong)bVar8 * -2 + 1) * 8);
    ifo = (info *)((long)ifo + (ulong)bVar8 * -0x10 + 8);
  }
  return;
}

Assistant:

void position::undo_move(const Move& m) {
	const Square from = Square(m.t);
	const Square to = Square(m.f);
	const Movetype t = Movetype(m.type);
	const Piece p = piece_on(from);
	const Color us = Color(to_move() ^ 1);
	Piece cp = ifo.captured;

	if (t == quiet) pcs.do_quiet(us, p, from, to, ifo);

	else if (t == capture) {
		pcs.do_quiet(us, p, from, to, ifo);
		pcs.add_piece(to_move(), cp, from, ifo);
	}

	else if (t == ep) {
		pcs.do_quiet(us, p, from, to, ifo);
		pcs.add_piece(to_move(), cp, Square(from + (us == white ? -8 : 8)), ifo);
	}

	else if (t < capture_promotion_q) {
		pcs.remove_piece(us, piece_on(from), from, ifo);
		pcs.add_piece(us, pawn, to, ifo);
	}

	else if (t < castle_ks) {
		pcs.remove_piece(us, piece_on(from), from, ifo);
		pcs.add_piece(to_move(), cp, from, ifo);
		pcs.add_piece(us, pawn, to, ifo);
	}

	else if (t == castle_ks) {
		Square rt = (us == white ? H1 : H8);
		Square rf = (us == white ? F1 : F8);
		pcs.do_quiet(us, king, from, to, ifo);
		pcs.do_quiet(us, rook, rf, rt, ifo);
	}

	else if (t == castle_qs) {
		Square rf = (us == white ? D1 : D8);
		Square rt = (us == white ? A1 : A8);
		pcs.do_quiet(us, king, from, to, ifo);
		pcs.do_quiet(us, rook, rf, rt, ifo);
	}
	ifo = history[--hidx];
}